

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

bool __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::operator==
          (ChannelGroupManifest *this,ChannelGroupManifest *other)

{
  bool bVar1;
  __type _Var2;
  
  if (this->_lifeTime == other->_lifeTime) {
    bVar1 = std::operator==(&this->_components,&other->_components);
    if (bVar1) {
      _Var2 = std::operator==(&this->_hashScheme,&other->_hashScheme);
      if (_Var2) {
        bVar1 = std::operator==(&this->_components,&other->_components);
        if (bVar1) {
          bVar1 = std::operator==(&(this->_table)._M_t,&(other->_table)._M_t);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
IDManifest::ChannelGroupManifest::operator== (
    const IDManifest::ChannelGroupManifest& other) const
{
    return (
        _lifeTime == other._lifeTime && _components == other._components &&
        _hashScheme == other._hashScheme && _components == other._components &&
        _table == other._table);
}